

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextGLImpl::DrawIndexed(DeviceContextGLImpl *this,DrawIndexedAttribs *Attribs)

{
  GLenum GLIndexType;
  GLenum GlTopology;
  size_t FirstIndexByteOffset;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::DrawIndexed
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs,0);
  PrepareForDraw(this,Attribs->Flags,true,&GlTopology);
  PrepareForIndexedDraw
            (this,Attribs->IndexType,Attribs->FirstIndexLocation,&GLIndexType,&FirstIndexByteOffset)
  ;
  if ((Attribs->NumIndices != 0) && (Attribs->NumInstances != 0)) {
    DrawElements(GlTopology,Attribs->NumIndices,GLIndexType,Attribs->NumInstances,
                 FirstIndexByteOffset,Attribs->BaseVertex,Attribs->FirstInstanceLocation);
  }
  PostDraw(this);
  return;
}

Assistant:

void DeviceContextGLImpl::DrawIndexed(const DrawIndexedAttribs& Attribs)
{
    TDeviceContextBase::DrawIndexed(Attribs, 0);

    GLenum GlTopology;
    PrepareForDraw(Attribs.Flags, true, GlTopology);
    GLenum GLIndexType;
    size_t FirstIndexByteOffset;
    PrepareForIndexedDraw(Attribs.IndexType, Attribs.FirstIndexLocation, GLIndexType, FirstIndexByteOffset);

    // NOTE: Base Vertex and Base Instance versions are not supported even in OpenGL ES 3.1
    // This functionality can be emulated by adjusting stream offsets. This, however may cause
    // errors in case instance data is read from the same stream as vertex data. Thus handling
    // such cases is left to the application

    if (Attribs.NumIndices > 0 && Attribs.NumInstances > 0)
    {
        DrawElements(GlTopology,
                     Attribs.NumIndices,
                     GLIndexType,
                     Attribs.NumInstances,
                     FirstIndexByteOffset,
                     Attribs.BaseVertex,
                     Attribs.FirstInstanceLocation);
    }

    PostDraw();
}